

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_stats_merge(tsdn_t *tsdn,arena_t *arena,uint *nthreads,char **dss,ssize_t *dirty_decay_ms
                      ,ssize_t *muzzy_decay_ms,size_t *nactive,size_t *ndirty,size_t *nmuzzy,
                      arena_stats_t *astats,bin_stats_t *bstats,arena_stats_large_t *lstats,
                      arena_stats_extents_t *estats)

{
  arena_stats_u64_t *paVar1;
  uint64_t *puVar2;
  extents_t *extents;
  extents_t *extents_00;
  extents_t *extents_01;
  bin_stats_t *pbVar3;
  malloc_mutex_t *mutex;
  long *plVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  cache_bin_array_descriptor_t *pcVar9;
  base_t *pbVar10;
  bin_t *pbVar11;
  long lVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint32_t uVar16;
  atomic_u32_t aVar17;
  int iVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  long lVar25;
  atomic_zu_t *paVar26;
  cache_bin_array_descriptor_t *pcVar27;
  long lVar28;
  size_t *psVar29;
  ulong uVar30;
  ulong uVar31;
  pszind_t pind;
  mutex_prof_data_t *source_2;
  mutex_prof_data_t *source_1;
  nstime_t *a;
  mutex_prof_data_t *source;
  nstime_t *pnVar32;
  size_t base_resident;
  size_t metadata_thp;
  size_t base_mapped;
  size_t base_allocated;
  
  arena_basic_stats_merge
            (tsdn,arena,nthreads,dss,dirty_decay_ms,muzzy_decay_ms,nactive,ndirty,nmuzzy);
  base_stats_get(tsdn,arena->base,&base_allocated,&base_resident,&base_mapped,&metadata_thp);
  (astats->mapped).repr = (astats->mapped).repr + (arena->stats).mapped.repr + base_mapped;
  extents = &arena->extents_retained;
  sVar19 = extents_npages_get(extents);
  (astats->retained).repr = (astats->retained).repr + sVar19 * 0x1000;
  (astats->extent_avail).repr = (arena->extent_avail_cnt).repr;
  (astats->decay_dirty).npurge.repr =
       (astats->decay_dirty).npurge.repr + (arena->stats).decay_dirty.npurge.repr;
  paVar1 = &(astats->decay_dirty).nmadvise;
  paVar1->repr = paVar1->repr + (arena->stats).decay_dirty.nmadvise.repr;
  paVar1 = &(astats->decay_dirty).purged;
  paVar1->repr = paVar1->repr + (arena->stats).decay_dirty.purged.repr;
  (astats->decay_muzzy).npurge.repr =
       (astats->decay_muzzy).npurge.repr + (arena->stats).decay_muzzy.npurge.repr;
  paVar1 = &(astats->decay_muzzy).nmadvise;
  paVar1->repr = paVar1->repr + (arena->stats).decay_muzzy.nmadvise.repr;
  paVar1 = &(astats->decay_muzzy).purged;
  paVar1->repr = paVar1->repr + (arena->stats).decay_muzzy.purged.repr;
  (astats->base).repr = (astats->base).repr + base_allocated;
  (astats->internal).repr = (astats->internal).repr + (arena->stats).internal.repr;
  (astats->metadata_thp).repr = (astats->metadata_thp).repr + metadata_thp;
  sVar19 = (arena->nactive).repr;
  extents_00 = &arena->extents_dirty;
  sVar20 = extents_npages_get(extents_00);
  extents_01 = &arena->extents_muzzy;
  sVar21 = extents_npages_get(extents_01);
  (astats->resident).repr =
       (astats->resident).repr + (sVar21 + sVar20 + sVar19) * 0x1000 + base_resident;
  psVar29 = sz_index2size_tab + 0x24;
  for (lVar25 = 0; lVar25 != 0x498; lVar25 = lVar25 + 6) {
    uVar6 = (&(arena->stats).lstats[0].nmalloc)[lVar25].repr;
    (&lstats->nmalloc)[lVar25].repr = (&lstats->nmalloc)[lVar25].repr + uVar6;
    (astats->nmalloc_large).repr = (astats->nmalloc_large).repr + uVar6;
    uVar7 = (&(arena->stats).lstats[0].ndalloc)[lVar25].repr;
    (&lstats->ndalloc)[lVar25].repr = (&lstats->ndalloc)[lVar25].repr + uVar7;
    (astats->ndalloc_large).repr = (astats->ndalloc_large).repr + uVar7;
    lVar28 = (&(arena->stats).lstats[0].nrequests)[lVar25].repr + uVar6;
    (&lstats->nrequests)[lVar25].repr = (&lstats->nrequests)[lVar25].repr + lVar28;
    (astats->nrequests_large).repr = (astats->nrequests_large).repr + lVar28;
    (&lstats->nfills)[lVar25].repr = (&lstats->nfills)[lVar25].repr + uVar6;
    (astats->nfills_large).repr = (astats->nfills_large).repr + uVar6;
    uVar8 = (&(arena->stats).lstats[0].nflushes)[lVar25].repr;
    (&lstats->nflushes)[lVar25].repr = (&lstats->nflushes)[lVar25].repr + uVar8;
    (astats->nflushes_large).repr = (astats->nflushes_large).repr + uVar8;
    (&lstats->curlextents)[lVar25] = (&lstats->curlextents)[lVar25] + (uVar6 - uVar7);
    (astats->allocated_large).repr = (astats->allocated_large).repr + (uVar6 - uVar7) * *psVar29;
    psVar29 = psVar29 + 1;
  }
  paVar26 = &estats->retained_bytes;
  for (lVar25 = 0; lVar25 != 199; lVar25 = lVar25 + 1) {
    pind = (pszind_t)lVar25;
    sVar19 = extents_nextents_get(extents_00,pind);
    sVar20 = extents_nextents_get(extents_01,pind);
    sVar21 = extents_nextents_get(extents,pind);
    sVar22 = extents_nbytes_get(extents_00,pind);
    sVar23 = extents_nbytes_get(extents_01,pind);
    sVar24 = extents_nbytes_get(extents,pind);
    (((arena_stats_extents_t *)(paVar26 + -5))->ndirty).repr = sVar19;
    paVar26[-3].repr = sVar20;
    paVar26[-1].repr = sVar21;
    paVar26[-4].repr = sVar22;
    paVar26[-2].repr = sVar23;
    paVar26->repr = sVar24;
    paVar26 = paVar26 + 6;
  }
  (astats->tcache_bytes).repr = 0;
  malloc_mutex_lock(tsdn,&arena->tcache_ql_mtx);
  pcVar27 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  while (pcVar27 != (cache_bin_array_descriptor_t *)0x0) {
    psVar29 = sz_index2size_tab;
    for (lVar25 = 0; lVar25 != 0x6c; lVar25 = lVar25 + 3) {
      (astats->tcache_bytes).repr =
           (astats->tcache_bytes).repr +
           (long)(&pcVar27->bins_small->ncached)[lVar25 * 2] * *psVar29;
      psVar29 = psVar29 + 1;
    }
    uVar30 = (ulong)nhbins;
    lVar25 = 0x364;
    for (uVar31 = 0x24; uVar31 < uVar30; uVar31 = uVar31 + 1) {
      (astats->tcache_bytes).repr =
           (astats->tcache_bytes).repr +
           (long)*(int *)((long)&pcVar27->bins_large->low_water + lVar25) *
           sz_index2size_tab[uVar31];
      lVar25 = lVar25 + 0x18;
    }
    pcVar9 = (pcVar27->link).qre_next;
    pcVar27 = (cache_bin_array_descriptor_t *)0x0;
    if (pcVar9 != (arena->cache_bin_array_descriptor_ql).qlh_first) {
      pcVar27 = pcVar9;
    }
  }
  uVar6 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x24);
  uVar14 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[8].prev_owner =
       (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[8].n_lock_ops = uVar15;
  astats->mutex_prof_data[8].max_n_thds = uVar16;
  astats->mutex_prof_data[8].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[8].n_owner_switches = uVar14;
  astats->mutex_prof_data[8].n_wait_times = uVar8;
  astats->mutex_prof_data[8].n_spin_acquired = uVar13;
  astats->mutex_prof_data[8].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[8].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[8].n_waiting_thds.repr = 0;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x40));
  malloc_mutex_lock(tsdn,&arena->large_mtx);
  uVar6 = (arena->large_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->large_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->large_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->large_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->large_mtx).field_0 + 0x24);
  uVar14 = (arena->large_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[0].prev_owner = (arena->large_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[0].n_lock_ops = uVar15;
  astats->mutex_prof_data[0].max_n_thds = uVar16;
  astats->mutex_prof_data[0].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[0].n_owner_switches = uVar14;
  astats->mutex_prof_data[0].n_wait_times = uVar8;
  astats->mutex_prof_data[0].n_spin_acquired = uVar13;
  astats->mutex_prof_data[0].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[0].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[0].n_waiting_thds.repr = 0;
  (arena->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x40));
  malloc_mutex_lock(tsdn,&arena->extent_avail_mtx);
  uVar6 = (arena->extent_avail_mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->extent_avail_mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x24);
  uVar14 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->extent_avail_mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[1].prev_owner =
       (arena->extent_avail_mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[1].n_lock_ops = uVar15;
  astats->mutex_prof_data[1].max_n_thds = uVar16;
  astats->mutex_prof_data[1].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[1].n_owner_switches = uVar14;
  astats->mutex_prof_data[1].n_wait_times = uVar8;
  astats->mutex_prof_data[1].n_spin_acquired = uVar13;
  astats->mutex_prof_data[1].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[1].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[1].n_waiting_thds.repr = 0;
  (arena->extent_avail_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extent_avail_mtx).field_0 + 0x40));
  malloc_mutex_lock(tsdn,&extents_00->mtx);
  uVar6 = (extents_00->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x24);
  uVar14 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->extents_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[2].prev_owner =
       (arena->extents_dirty).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[2].n_lock_ops = uVar15;
  astats->mutex_prof_data[2].max_n_thds = uVar16;
  astats->mutex_prof_data[2].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[2].n_owner_switches = uVar14;
  astats->mutex_prof_data[2].n_wait_times = uVar8;
  astats->mutex_prof_data[2].n_spin_acquired = uVar13;
  astats->mutex_prof_data[2].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[2].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[2].n_waiting_thds.repr = 0;
  (arena->extents_dirty).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extents_dirty).mtx.field_0 + 0x40));
  malloc_mutex_lock(tsdn,&extents_01->mtx);
  uVar6 = (extents_01->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x24);
  uVar14 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->extents_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[3].prev_owner =
       (arena->extents_muzzy).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[3].n_lock_ops = uVar15;
  astats->mutex_prof_data[3].max_n_thds = uVar16;
  astats->mutex_prof_data[3].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[3].n_owner_switches = uVar14;
  astats->mutex_prof_data[3].n_wait_times = uVar8;
  astats->mutex_prof_data[3].n_spin_acquired = uVar13;
  astats->mutex_prof_data[3].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[3].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[3].n_waiting_thds.repr = 0;
  (arena->extents_muzzy).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extents_muzzy).mtx.field_0 + 0x40));
  malloc_mutex_lock(tsdn,&extents->mtx);
  uVar6 = (extents->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->extents_retained).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x24);
  uVar14 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->extents_retained).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[4].prev_owner =
       (arena->extents_retained).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[4].n_lock_ops = uVar15;
  astats->mutex_prof_data[4].max_n_thds = uVar16;
  astats->mutex_prof_data[4].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[4].n_owner_switches = uVar14;
  astats->mutex_prof_data[4].n_wait_times = uVar8;
  astats->mutex_prof_data[4].n_spin_acquired = uVar13;
  astats->mutex_prof_data[4].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[4].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[4].n_waiting_thds.repr = 0;
  (arena->extents_retained).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->extents_retained).mtx.field_0 + 0x40));
  malloc_mutex_lock(tsdn,&(arena->decay_dirty).mtx);
  uVar6 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x24);
  uVar14 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->decay_dirty).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[5].prev_owner =
       (arena->decay_dirty).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[5].n_lock_ops = uVar15;
  astats->mutex_prof_data[5].max_n_thds = uVar16;
  astats->mutex_prof_data[5].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[5].n_owner_switches = uVar14;
  astats->mutex_prof_data[5].n_wait_times = uVar8;
  astats->mutex_prof_data[5].n_spin_acquired = uVar13;
  astats->mutex_prof_data[5].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[5].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[5].n_waiting_thds.repr = 0;
  (arena->decay_dirty).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->decay_dirty).mtx.field_0 + 0x40));
  malloc_mutex_lock(tsdn,&(arena->decay_muzzy).mtx);
  uVar6 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_wait_times;
  uVar13 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x24);
  uVar14 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (arena->decay_muzzy).mtx.field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[6].prev_owner =
       (arena->decay_muzzy).mtx.field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[6].n_lock_ops = uVar15;
  astats->mutex_prof_data[6].max_n_thds = uVar16;
  astats->mutex_prof_data[6].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[6].n_owner_switches = uVar14;
  astats->mutex_prof_data[6].n_wait_times = uVar8;
  astats->mutex_prof_data[6].n_spin_acquired = uVar13;
  astats->mutex_prof_data[6].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[6].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[6].n_waiting_thds.repr = 0;
  (arena->decay_muzzy).mtx.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(arena->decay_muzzy).mtx.field_0 + 0x40));
  malloc_mutex_lock(tsdn,&arena->base->mtx);
  pbVar10 = arena->base;
  uVar6 = (pbVar10->mtx).field_0.field_0.prof_data.tot_wait_time.ns;
  uVar7 = (pbVar10->mtx).field_0.field_0.prof_data.max_wait_time.ns;
  uVar8 = (pbVar10->mtx).field_0.field_0.prof_data.n_wait_times;
  uVar13 = (pbVar10->mtx).field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = *(uint32_t *)((long)&(pbVar10->mtx).field_0 + 0x20);
  aVar17.repr = *(uint32_t *)((long)&(pbVar10->mtx).field_0 + 0x24);
  uVar14 = (pbVar10->mtx).field_0.field_0.prof_data.n_owner_switches;
  uVar15 = (pbVar10->mtx).field_0.field_0.prof_data.n_lock_ops;
  astats->mutex_prof_data[7].prev_owner = (pbVar10->mtx).field_0.field_0.prof_data.prev_owner;
  astats->mutex_prof_data[7].n_lock_ops = uVar15;
  astats->mutex_prof_data[7].max_n_thds = uVar16;
  astats->mutex_prof_data[7].n_waiting_thds = (atomic_u32_t)aVar17.repr;
  astats->mutex_prof_data[7].n_owner_switches = uVar14;
  astats->mutex_prof_data[7].n_wait_times = uVar8;
  astats->mutex_prof_data[7].n_spin_acquired = uVar13;
  astats->mutex_prof_data[7].tot_wait_time.ns = uVar6;
  astats->mutex_prof_data[7].max_wait_time.ns = uVar7;
  astats->mutex_prof_data[7].n_waiting_thds.repr = 0;
  pbVar10 = arena->base;
  (pbVar10->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar10->mtx).field_0 + 0x40));
  pnVar32 = &astats->uptime;
  nstime_copy(pnVar32,&arena->create_time);
  nstime_update_impl(pnVar32);
  nstime_subtract(pnVar32,&arena->create_time);
  for (lVar25 = 0; lVar25 != 0x24; lVar25 = lVar25 + 1) {
    pbVar3 = bstats + lVar25;
    pnVar32 = &bstats[lVar25].mutex_data.max_wait_time;
    lVar28 = 0;
    for (uVar31 = 0; uVar31 < bin_infos[lVar25].n_shards; uVar31 = uVar31 + 1) {
      pbVar11 = arena->bins[lVar25].bin_shards;
      mutex = (malloc_mutex_t *)((long)&(pbVar11->lock).field_0 + lVar28);
      malloc_mutex_lock(tsdn,mutex);
      nstime_add(&bstats[lVar25].mutex_data.tot_wait_time,(nstime_t *)mutex);
      a = (nstime_t *)((long)&(pbVar11->lock).field_0 + lVar28 + 8);
      iVar18 = nstime_compare(a,pnVar32);
      if (0 < iVar18) {
        nstime_copy(pnVar32,a);
      }
      plVar4 = (long *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x10);
      lVar12 = plVar4[1];
      (pbVar3->mutex_data).n_wait_times = (pbVar3->mutex_data).n_wait_times + *plVar4;
      (pbVar3->mutex_data).n_spin_acquired = (pbVar3->mutex_data).n_spin_acquired + lVar12;
      uVar5 = *(uint *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x20);
      if ((pbVar3->mutex_data).max_n_thds < uVar5) {
        (pbVar3->mutex_data).max_n_thds = uVar5;
      }
      (pbVar3->mutex_data).n_waiting_thds.repr = 0;
      puVar2 = &(pbVar3->mutex_data).n_owner_switches;
      *puVar2 = *puVar2 + *(long *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x28);
      puVar2 = &(pbVar3->mutex_data).n_lock_ops;
      *puVar2 = *puVar2 + *(long *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x38);
      lVar12 = *(long *)((long)&(pbVar11->stats).ndalloc + lVar28);
      pbVar3->nmalloc = pbVar3->nmalloc + *(long *)((long)&(pbVar11->stats).nmalloc + lVar28);
      pbVar3->ndalloc = pbVar3->ndalloc + lVar12;
      lVar12 = *(long *)((long)&(pbVar11->stats).curregs + lVar28);
      pbVar3->nrequests = *(long *)((long)&(pbVar11->stats).nrequests + lVar28) + pbVar3->nrequests;
      pbVar3->curregs = lVar12 + pbVar3->curregs;
      lVar12 = *(long *)((long)&(pbVar11->stats).nflushes + lVar28);
      pbVar3->nfills = *(long *)((long)&(pbVar11->stats).nfills + lVar28) + pbVar3->nfills;
      pbVar3->nflushes = lVar12 + pbVar3->nflushes;
      lVar12 = *(long *)((long)&(pbVar11->stats).reslabs + lVar28);
      pbVar3->nslabs = pbVar3->nslabs + *(long *)((long)&(pbVar11->stats).nslabs + lVar28);
      pbVar3->reslabs = pbVar3->reslabs + lVar12;
      lVar12 = *(long *)((long)&(pbVar11->stats).nonfull_slabs + lVar28);
      pbVar3->curslabs = pbVar3->curslabs + *(long *)((long)&(pbVar11->stats).curslabs + lVar28);
      pbVar3->nonfull_slabs = pbVar3->nonfull_slabs + lVar12;
      *(undefined1 *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x68) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar11->lock).field_0 + lVar28 + 0x40));
      lVar28 = lVar28 + 0x118;
    }
  }
  return;
}

Assistant:

void
arena_stats_merge(tsdn_t *tsdn, arena_t *arena, unsigned *nthreads,
    const char **dss, ssize_t *dirty_decay_ms, ssize_t *muzzy_decay_ms,
    size_t *nactive, size_t *ndirty, size_t *nmuzzy, arena_stats_t *astats,
    bin_stats_t *bstats, arena_stats_large_t *lstats,
    arena_stats_extents_t *estats) {
	cassert(config_stats);

	arena_basic_stats_merge(tsdn, arena, nthreads, dss, dirty_decay_ms,
	    muzzy_decay_ms, nactive, ndirty, nmuzzy);

	size_t base_allocated, base_resident, base_mapped, metadata_thp;
	base_stats_get(tsdn, arena->base, &base_allocated, &base_resident,
	    &base_mapped, &metadata_thp);

	arena_stats_lock(tsdn, &arena->stats);

	arena_stats_accum_zu(&astats->mapped, base_mapped
	    + arena_stats_read_zu(tsdn, &arena->stats, &arena->stats.mapped));
	arena_stats_accum_zu(&astats->retained,
	    extents_npages_get(&arena->extents_retained) << LG_PAGE);

	atomic_store_zu(&astats->extent_avail,
	    atomic_load_zu(&arena->extent_avail_cnt, ATOMIC_RELAXED),
	    ATOMIC_RELAXED);

	arena_stats_accum_u64(&astats->decay_dirty.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.npurge));
	arena_stats_accum_u64(&astats->decay_dirty.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.nmadvise));
	arena_stats_accum_u64(&astats->decay_dirty.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_dirty.purged));

	arena_stats_accum_u64(&astats->decay_muzzy.npurge,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.npurge));
	arena_stats_accum_u64(&astats->decay_muzzy.nmadvise,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.nmadvise));
	arena_stats_accum_u64(&astats->decay_muzzy.purged,
	    arena_stats_read_u64(tsdn, &arena->stats,
	    &arena->stats.decay_muzzy.purged));

	arena_stats_accum_zu(&astats->base, base_allocated);
	arena_stats_accum_zu(&astats->internal, arena_internal_get(arena));
	arena_stats_accum_zu(&astats->metadata_thp, metadata_thp);
	arena_stats_accum_zu(&astats->resident, base_resident +
	    (((atomic_load_zu(&arena->nactive, ATOMIC_RELAXED) +
	    extents_npages_get(&arena->extents_dirty) +
	    extents_npages_get(&arena->extents_muzzy)) << LG_PAGE)));

	for (szind_t i = 0; i < SC_NSIZES - SC_NBINS; i++) {
		uint64_t nmalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nmalloc);
		arena_stats_accum_u64(&lstats[i].nmalloc, nmalloc);
		arena_stats_accum_u64(&astats->nmalloc_large, nmalloc);

		uint64_t ndalloc = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].ndalloc);
		arena_stats_accum_u64(&lstats[i].ndalloc, ndalloc);
		arena_stats_accum_u64(&astats->ndalloc_large, ndalloc);

		uint64_t nrequests = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nrequests);
		arena_stats_accum_u64(&lstats[i].nrequests,
		    nmalloc + nrequests);
		arena_stats_accum_u64(&astats->nrequests_large,
		    nmalloc + nrequests);

		/* nfill == nmalloc for large currently. */
		arena_stats_accum_u64(&lstats[i].nfills, nmalloc);
		arena_stats_accum_u64(&astats->nfills_large, nmalloc);

		uint64_t nflush = arena_stats_read_u64(tsdn, &arena->stats,
		    &arena->stats.lstats[i].nflushes);
		arena_stats_accum_u64(&lstats[i].nflushes, nflush);
		arena_stats_accum_u64(&astats->nflushes_large, nflush);

		assert(nmalloc >= ndalloc);
		assert(nmalloc - ndalloc <= SIZE_T_MAX);
		size_t curlextents = (size_t)(nmalloc - ndalloc);
		lstats[i].curlextents += curlextents;
		arena_stats_accum_zu(&astats->allocated_large,
		    curlextents * sz_index2size(SC_NBINS + i));
	}

	for (pszind_t i = 0; i < SC_NPSIZES; i++) {
		size_t dirty, muzzy, retained, dirty_bytes, muzzy_bytes,
		    retained_bytes;
		dirty = extents_nextents_get(&arena->extents_dirty, i);
		muzzy = extents_nextents_get(&arena->extents_muzzy, i);
		retained = extents_nextents_get(&arena->extents_retained, i);
		dirty_bytes = extents_nbytes_get(&arena->extents_dirty, i);
		muzzy_bytes = extents_nbytes_get(&arena->extents_muzzy, i);
		retained_bytes =
		    extents_nbytes_get(&arena->extents_retained, i);

		atomic_store_zu(&estats[i].ndirty, dirty, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nmuzzy, muzzy, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].nretained, retained, ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].dirty_bytes, dirty_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].muzzy_bytes, muzzy_bytes,
		    ATOMIC_RELAXED);
		atomic_store_zu(&estats[i].retained_bytes, retained_bytes,
		    ATOMIC_RELAXED);
	}

	arena_stats_unlock(tsdn, &arena->stats);

	/* tcache_bytes counts currently cached bytes. */
	atomic_store_zu(&astats->tcache_bytes, 0, ATOMIC_RELAXED);
	malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);
	cache_bin_array_descriptor_t *descriptor;
	ql_foreach(descriptor, &arena->cache_bin_array_descriptor_ql, link) {
		szind_t i = 0;
		for (; i < SC_NBINS; i++) {
			cache_bin_t *tbin = &descriptor->bins_small[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
		for (; i < nhbins; i++) {
			cache_bin_t *tbin = &descriptor->bins_large[i];
			arena_stats_accum_zu(&astats->tcache_bytes,
			    tbin->ncached * sz_index2size(i));
		}
	}
	malloc_mutex_prof_read(tsdn,
	    &astats->mutex_prof_data[arena_prof_mutex_tcache_list],
	    &arena->tcache_ql_mtx);
	malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);

#define READ_ARENA_MUTEX_PROF_DATA(mtx, ind)				\
    malloc_mutex_lock(tsdn, &arena->mtx);				\
    malloc_mutex_prof_read(tsdn, &astats->mutex_prof_data[ind],		\
        &arena->mtx);							\
    malloc_mutex_unlock(tsdn, &arena->mtx);

	/* Gather per arena mutex profiling data. */
	READ_ARENA_MUTEX_PROF_DATA(large_mtx, arena_prof_mutex_large);
	READ_ARENA_MUTEX_PROF_DATA(extent_avail_mtx,
	    arena_prof_mutex_extent_avail)
	READ_ARENA_MUTEX_PROF_DATA(extents_dirty.mtx,
	    arena_prof_mutex_extents_dirty)
	READ_ARENA_MUTEX_PROF_DATA(extents_muzzy.mtx,
	    arena_prof_mutex_extents_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(extents_retained.mtx,
	    arena_prof_mutex_extents_retained)
	READ_ARENA_MUTEX_PROF_DATA(decay_dirty.mtx,
	    arena_prof_mutex_decay_dirty)
	READ_ARENA_MUTEX_PROF_DATA(decay_muzzy.mtx,
	    arena_prof_mutex_decay_muzzy)
	READ_ARENA_MUTEX_PROF_DATA(base->mtx,
	    arena_prof_mutex_base)
#undef READ_ARENA_MUTEX_PROF_DATA

	nstime_copy(&astats->uptime, &arena->create_time);
	nstime_update(&astats->uptime);
	nstime_subtract(&astats->uptime, &arena->create_time);

	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_stats_merge(tsdn, &bstats[i],
			    &arena->bins[i].bin_shards[j]);
		}
	}
}